

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.h
# Opt level: O2

ostream * operator<<(ostream *out,Person *p)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"Id : ");
  poVar1 = std::operator<<(poVar1,(string *)&p->id);
  poVar1 = std::operator<<(poVar1," Name : ");
  poVar1 = std::operator<<(poVar1,(string *)&p->name);
  poVar1 = std::operator<<(poVar1," Address : ");
  poVar1 = operator<<(poVar1,&p->address);
  std::endl<char,std::char_traits<char>>(poVar1);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Person &p) {
        out << "Id : " << p.id << " Name : " << p.name << " Address : " << p.address << std::endl;
        return out;
    }